

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf-hash.cpp
# Opt level: O2

hash_manifest_result_t
manifest_verify(string *manifest_file,string *hash_type_str,string *hash_str,string *tensor_name)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  __type _Var4;
  istream *piVar5;
  hash_manifest_result_t hVar6;
  hash_manifest_result_t local_454;
  string file_hash;
  string file_tensor_name;
  string file_hash_type;
  string manifest_entry_line;
  ifstream file;
  istringstream line_stream;
  
  if (manifest_file->_M_string_length == 0) {
    hVar6 = HASH_MANIFEST_NOT_FOUND;
  }
  else {
    std::ifstream::ifstream(&file,(string *)manifest_file,_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    hVar6 = HASH_MANIFEST_NOT_FOUND;
    if (cVar1 != '\0') {
      manifest_entry_line._M_dataplus._M_p = (pointer)&manifest_entry_line.field_2;
      manifest_entry_line._M_string_length = 0;
      manifest_entry_line.field_2._M_local_buf[0] = '\0';
      do {
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&file,(string *)&manifest_entry_line);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
          local_454 = HASH_MANIFEST_NOT_FOUND;
          break;
        }
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&line_stream,(string *)&manifest_entry_line,_S_in);
        file_hash_type._M_dataplus._M_p = (pointer)&file_hash_type.field_2;
        file_hash_type._M_string_length = 0;
        file_hash._M_dataplus._M_p = (pointer)&file_hash.field_2;
        file_hash._M_string_length = 0;
        file_hash_type.field_2._M_local_buf[0] = '\0';
        file_hash.field_2._M_local_buf[0] = '\0';
        file_tensor_name._M_dataplus._M_p = (pointer)&file_tensor_name.field_2;
        file_tensor_name._M_string_length = 0;
        file_tensor_name.field_2._M_local_buf[0] = '\0';
        piVar5 = std::operator>>((istream *)&line_stream,(string *)&file_hash_type);
        piVar5 = std::operator>>(piVar5,(string *)&file_hash);
        piVar5 = std::operator>>(piVar5,(string *)&file_tensor_name);
        bVar2 = false;
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
          bVar2 = std::operator!=(&file_hash_type,hash_type_str);
          if (bVar2) {
            bVar2 = false;
          }
          else {
            bVar3 = std::operator!=(&file_tensor_name,tensor_name);
            bVar2 = false;
            if (!bVar3) {
              _Var4 = std::operator==(&file_hash,hash_str);
              local_454 = _Var4 + HASH_MANIFEST_MISMATCH;
              bVar2 = true;
            }
          }
        }
        std::__cxx11::string::~string((string *)&file_tensor_name);
        std::__cxx11::string::~string((string *)&file_hash);
        std::__cxx11::string::~string((string *)&file_hash_type);
        std::__cxx11::istringstream::~istringstream((istringstream *)&line_stream);
      } while (!bVar2);
      std::__cxx11::string::~string((string *)&manifest_entry_line);
      hVar6 = local_454;
    }
    std::ifstream::~ifstream(&file);
  }
  return hVar6;
}

Assistant:

static hash_manifest_result_t manifest_verify(const std::string& manifest_file, const std::string& hash_type_str, const std::string& hash_str, const std::string& tensor_name) {
    if (manifest_file.empty()) {
        return HASH_MANIFEST_NOT_FOUND;
    }

    std::ifstream file(manifest_file);
    if (!file.is_open()) {
        return HASH_MANIFEST_NOT_FOUND;
    }

    std::string manifest_entry_line;
    while (getline(file, manifest_entry_line)) {
        std::istringstream line_stream(manifest_entry_line);
        std::string file_hash_type;
        std::string file_hash;
        std::string file_tensor_name;
        if (line_stream >> file_hash_type >> file_hash >> file_tensor_name) {
            // Line parsed. Check hash validity

            if (file_hash_type != hash_type_str) {
                continue;
            }

            if (file_tensor_name != tensor_name) {
                continue;
            }

            return (file_hash == hash_str) ? HASH_MANIFEST_OK : HASH_MANIFEST_MISMATCH;
        }
    }

    return HASH_MANIFEST_NOT_FOUND;
}